

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mk_mdef_gen.c
# Opt level: O3

int32 make_dict_triphone_list
                (dicthashelement_t **dicthash,hashelement_t ***triphonehash,int ignore_wpos)

{
  char *pcVar1;
  phnhashelement_t *ppVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  hashelement_t **hashtable;
  phnhashelement_t **hashtable_00;
  phnhashelement_t **hashtable_01;
  phnhashelement_t *ppVar6;
  hashelement_t *phVar7;
  long lVar8;
  char *pcVar9;
  char *wp;
  uint uVar10;
  char *wp_00;
  dicthashelement_t *pdVar11;
  ulong uVar12;
  char *pcVar13;
  long lVar14;
  ulong uVar15;
  char **ppcVar16;
  ulong uVar17;
  char *__s1;
  long lVar18;
  bool bVar19;
  uint local_b0;
  uint local_ac;
  uint local_7c;
  
  hashtable = (hashelement_t **)
              __ckd_calloc__(0x5dc1,0x30,
                             "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/mk_mdef_gen/mk_mdef_gen.c"
                             ,0x159);
  hashtable_00 = (phnhashelement_t **)calloc(0x65,0x18);
  hashtable_01 = (phnhashelement_t **)calloc(0x65,0x18);
  if ((hashtable_00 == (phnhashelement_t **)0x0) || (hashtable_01 == (phnhashelement_t **)0x0)) {
    err_msg(ERR_FATAL,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/mk_mdef_gen/mk_mdef_gen.c"
            ,0x15d,"Unable to alloc %d size phone hashtables!\n",0x65);
    exit(1);
  }
  phninstall("SIL",hashtable_00);
  phninstall("SIL",hashtable_01);
  lVar14 = 0;
  do {
    for (pdVar11 = dicthash[lVar14]; pdVar11 != (dicthashelement_t *)0x0; pdVar11 = pdVar11->next) {
      ppcVar16 = pdVar11->phones;
      pcVar9 = *ppcVar16;
      if ((*pcVar9 != '+') && (iVar3 = strcmp(pcVar9,"SIL"), iVar3 != 0)) {
        phninstall(pcVar9,hashtable_00);
        ppcVar16 = pdVar11->phones;
      }
      pcVar9 = ppcVar16[(long)pdVar11->nphns + -1];
      if ((*pcVar9 != '+') && (iVar3 = strcmp(pcVar9,"SIL"), iVar3 != 0)) {
        phninstall(pcVar9,hashtable_01);
      }
    }
    lVar14 = lVar14 + 1;
  } while (lVar14 != 0x2717);
  bVar19 = ignore_wpos != 0;
  pcVar9 = "b";
  if (bVar19) {
    pcVar9 = "i";
  }
  wp = "e";
  if (bVar19) {
    wp = "i";
  }
  wp_00 = "s";
  if (bVar19) {
    wp_00 = "i";
  }
  lVar14 = 0;
  uVar10 = 0;
  local_7c = 0;
  uVar17 = 0;
  local_ac = 0;
  uVar12 = 0;
  do {
    pdVar11 = dicthash[lVar14];
joined_r0x00103ff7:
    if (pdVar11 != (dicthashelement_t *)0x0) {
      do {
        uVar4 = (uint)uVar12;
LAB_00104008:
        uVar4 = uVar4 + 1;
        uVar12 = (ulong)uVar4;
        iVar3 = pdVar11->nphns;
        ppcVar16 = pdVar11->phones;
        pcVar1 = *ppcVar16;
        local_b0 = (uint)uVar17;
        if ((long)iVar3 == 1) {
          if ((*pcVar1 == '+') || (iVar3 = strcmp(pcVar1,"SIL"), iVar3 == 0)) goto LAB_00104073;
          lVar8 = 0;
          do {
            for (ppVar6 = hashtable_01[lVar8]; ppVar6 != (phnhashelement_t *)0x0;
                ppVar6 = ppVar6->next) {
              pcVar13 = ppVar6->phone;
              lVar18 = 0;
              do {
                for (ppVar2 = hashtable_00[lVar18]; ppVar2 != (phnhashelement_t *)0x0;
                    ppVar2 = ppVar2->next) {
                  phVar7 = install(pcVar1,pcVar13,ppVar2->phone,wp_00,hashtable);
                  uVar10 = uVar10 + (phVar7->dictcount == 0);
                  phVar7->dictcount = phVar7->dictcount + 1;
                }
                lVar18 = lVar18 + 1;
              } while (lVar18 != 0x65);
            }
            lVar8 = lVar8 + 1;
          } while (lVar8 != 0x65);
          goto LAB_001042b0;
        }
        if ((*pcVar1 == '+') || (iVar5 = strcmp(pcVar1,"SIL"), iVar5 == 0)) goto LAB_00104073;
        pcVar13 = ppcVar16[1];
        if ((*pcVar13 == '+') || (iVar5 = strcmp(pcVar13,"SIL"), iVar5 == 0)) {
          pcVar13 = "SIL";
        }
        lVar8 = 0;
        do {
          for (ppVar6 = hashtable_01[lVar8]; ppVar6 != (phnhashelement_t *)0x0;
              ppVar6 = ppVar6->next) {
            phVar7 = install(pcVar1,ppVar6->phone,pcVar13,pcVar9,hashtable);
            local_ac = local_ac + (phVar7->dictcount == 0);
            phVar7->dictcount = phVar7->dictcount + 1;
          }
          lVar8 = lVar8 + 1;
        } while (lVar8 != 0x65);
        if (2 < iVar3) {
          uVar15 = 1;
          do {
            ppcVar16 = pdVar11->phones;
            pcVar1 = ppcVar16[uVar15];
            if ((*pcVar1 != '+') && (iVar5 = strcmp(pcVar1,"SIL"), iVar5 != 0)) {
              pcVar13 = ppcVar16[uVar15 - 1];
              if ((*pcVar13 == '+') || (iVar5 = strcmp(pcVar13,"SIL"), iVar5 == 0)) {
                pcVar13 = "SIL";
              }
              __s1 = ppcVar16[uVar15 + 1];
              if ((*__s1 == '+') || (iVar5 = strcmp(__s1,"SIL"), iVar5 == 0)) {
                __s1 = "SIL";
              }
              phVar7 = install(pcVar1,pcVar13,__s1,"i",hashtable);
              local_7c = local_7c + (phVar7->dictcount == 0);
              phVar7->dictcount = phVar7->dictcount + 1;
            }
            uVar15 = uVar15 + 1;
          } while (iVar3 - 1U != uVar15);
        }
        ppcVar16 = pdVar11->phones;
        pcVar1 = ppcVar16[(int)(iVar3 - 1U)];
        if ((*pcVar1 != '+') && (iVar5 = strcmp(pcVar1,"SIL"), iVar5 != 0)) goto LAB_00104331;
        pdVar11 = pdVar11->next;
        if (pdVar11 == (dicthashelement_t *)0x0) break;
      } while( true );
    }
LAB_001043d7:
    lVar14 = lVar14 + 1;
    if (lVar14 == 0x2717) {
      err_msg(ERR_INFO,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/mk_mdef_gen/mk_mdef_gen.c"
              ,0x1ba,"%d words in dictionary\n",uVar12);
      err_msg(ERR_INFO,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/mk_mdef_gen/mk_mdef_gen.c"
              ,0x1bb,"%d unique single word triphones in dictionary\n",(ulong)uVar10);
      err_msg(ERR_INFO,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/mk_mdef_gen/mk_mdef_gen.c"
              ,0x1bc,"%d unique word beginning triphones in dictionary\n",(ulong)local_ac);
      err_msg(ERR_INFO,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/mk_mdef_gen/mk_mdef_gen.c"
              ,0x1bd,"%d unique word internal triphones in dictionary\n",(ulong)local_7c);
      err_msg(ERR_INFO,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/mk_mdef_gen/mk_mdef_gen.c"
              ,0x1be,"%d unique word ending triphones in dictionary\n",uVar17);
      *triphonehash = hashtable;
      freephnhash(hashtable_00);
      freephnhash(hashtable_01);
      return 0;
    }
  } while( true );
LAB_00104331:
  pcVar13 = ppcVar16[(long)iVar3 + -2];
  if ((*pcVar13 == '+') || (iVar3 = strcmp(pcVar13,"SIL"), iVar3 == 0)) {
    pcVar13 = "SIL";
  }
  lVar8 = 0;
  do {
    for (ppVar6 = hashtable_00[lVar8]; ppVar6 != (phnhashelement_t *)0x0; ppVar6 = ppVar6->next) {
      phVar7 = install(pcVar1,pcVar13,ppVar6->phone,wp,hashtable);
      local_b0 = local_b0 + (phVar7->dictcount == 0);
      phVar7->dictcount = phVar7->dictcount + 1;
    }
    lVar8 = lVar8 + 1;
  } while (lVar8 != 0x65);
LAB_001042b0:
  pdVar11 = pdVar11->next;
  uVar17 = (ulong)local_b0;
  goto joined_r0x00103ff7;
LAB_00104073:
  pdVar11 = pdVar11->next;
  if (pdVar11 == (dicthashelement_t *)0x0) goto LAB_001043d7;
  goto LAB_00104008;
}

Assistant:

int32 make_dict_triphone_list (dicthashelement_t **dicthash,
			  hashelement_t ***triphonehash,
			  int ignore_wpos)
{
    hashelement_t **tphnhash, *tphnptr;
    dicthashelement_t *word_el;
    phnhashelement_t *bphnptr, **bphnhash, *ephnptr, **ephnhash;
    char *bphn, *lctx, *rctx;
    const char* wpos;
    char *silencephn = "SIL";
    int32 totaltphs, totwds, bwdtphs, ewdtphs, iwdtphs, swdtphs, lnphns;
    int32 i,j,k;

    tphnhash = (hashelement_t**) ckd_calloc(HASHSIZE, sizeof(hashelement_t));
    bphnhash = (phnhashelement_t**)calloc(PHNHASHSIZE,sizeof(phnhashelement_t));
    ephnhash = (phnhashelement_t**)calloc(PHNHASHSIZE,sizeof(phnhashelement_t));
    if (bphnhash == NULL || ephnhash == NULL)
	E_FATAL("Unable to alloc %d size phone hashtables!\n",(int)PHNHASHSIZE);

    /*First count all phones that can begin or end a word (SIL can by default)*/
    phninstall(silencephn,bphnhash);
    phninstall(silencephn,ephnhash);
    for (i = 0; i < DICTHASHSIZE; i++){
        word_el = dicthash[i];
        while (word_el != NULL){
	    if (!IS_FILLER(word_el->phones[0]))
	        phninstall(word_el->phones[0],bphnhash);
	    if (!IS_FILLER(word_el->phones[word_el->nphns - 1]))
	        phninstall(word_el->phones[word_el->nphns - 1],ephnhash);
	    word_el = word_el->next;
        }
    }

    /* Scan dictionary and make triphone list */
    totwds = bwdtphs = ewdtphs = iwdtphs = swdtphs = 0;
    for (i = 0; i < DICTHASHSIZE; i++){
        word_el = dicthash[i];
        while (word_el != NULL){
	    totwds++;
            lnphns = word_el->nphns;
            if (lnphns == 1) {
                wpos = wordpos2str(WORD_POSN_SINGLE, ignore_wpos);
                bphn = word_el->phones[0];
		if (IS_FILLER(bphn)) {word_el = word_el->next; continue;}
		for (j = 0; j < PHNHASHSIZE; j++){
		    ephnptr = ephnhash[j];
		    while (ephnptr != NULL){
			lctx = ephnptr->phone;
		        for (k = 0; k < PHNHASHSIZE; k++){
		    	    bphnptr = bphnhash[k];
		    	    while (bphnptr != NULL){
				rctx = bphnptr->phone;
                                tphnptr = install(bphn,lctx,rctx,wpos,tphnhash);
				if (tphnptr->dictcount == 0) swdtphs++;
				tphnptr->dictcount++;
				bphnptr = bphnptr->next;
			    }
			}
			ephnptr = ephnptr->next;
		    }
		}
            }
            else {
                wpos = wordpos2str(WORD_POSN_BEGIN, ignore_wpos);
                bphn = word_el->phones[0];
		if (IS_FILLER(bphn)) {word_el = word_el->next; continue;}
		rctx = word_el->phones[1];
		if (IS_FILLER(rctx)) rctx = silencephn;
		for (j = 0; j < PHNHASHSIZE; j++){
		    ephnptr = ephnhash[j];
		    while (ephnptr != NULL){
			lctx = ephnptr->phone;
                        tphnptr = install(bphn,lctx,rctx,wpos,tphnhash);
			if (tphnptr->dictcount == 0) bwdtphs++;
			tphnptr->dictcount++;
			ephnptr = ephnptr->next;
		    }
		}
                wpos = wordpos2str(WORD_POSN_INTERNAL, ignore_wpos);
                for (j=1;j<lnphns-1;j++){
                    bphn = word_el->phones[j];
		    if (IS_FILLER(bphn)) continue;
                    lctx = word_el->phones[j-1];
		    if (IS_FILLER(lctx)) lctx = silencephn;
                    rctx = word_el->phones[j+1];
		    if (IS_FILLER(rctx)) rctx = silencephn;
                    tphnptr = install(bphn,lctx,rctx,wpos,tphnhash);
		    if (tphnptr->dictcount == 0) iwdtphs++;
		    tphnptr->dictcount++;
                }
                wpos = wordpos2str(WORD_POSN_END, ignore_wpos);
                bphn = word_el->phones[lnphns-1];
		if (IS_FILLER(bphn)) {word_el = word_el->next; continue;}
		lctx = word_el->phones[lnphns-2];
		if (IS_FILLER(lctx)) lctx = silencephn;
		for (j = 0; j < PHNHASHSIZE; j++){
		    bphnptr = bphnhash[j];
		    while (bphnptr != NULL){
			rctx = bphnptr->phone;
                        tphnptr = install(bphn,lctx,rctx,wpos,tphnhash);
			if (tphnptr->dictcount == 0) ewdtphs++;
			tphnptr->dictcount++;
			bphnptr = bphnptr->next;
		    }
		}
            }
	    word_el = word_el->next;
        }
    }
    totaltphs = swdtphs + bwdtphs + iwdtphs + ewdtphs;
    E_INFO("%d words in dictionary\n",totwds);
    E_INFO("%d unique single word triphones in dictionary\n",swdtphs);
    E_INFO("%d unique word beginning triphones in dictionary\n",bwdtphs);
    E_INFO("%d unique word internal triphones in dictionary\n",iwdtphs);
    E_INFO("%d unique word ending triphones in dictionary\n",ewdtphs);

    *triphonehash = tphnhash;

    freephnhash(bphnhash); freephnhash(ephnhash);

    return S3_SUCCESS;
}